

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

Edge * __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Edge>::newObject
          (Pool<btConvexHullInternal::Edge> *this)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RSI;
  undefined8 *in_RDI;
  PoolArray<btConvexHullInternal::Edge> *p;
  Edge *o;
  int in_stack_ffffffffffffffcc;
  PoolArray<btConvexHullInternal::Edge> *in_stack_ffffffffffffffd0;
  PoolArray<btConvexHullInternal::Edge> *local_18;
  Edge *local_10;
  
  local_10 = (Edge *)in_RDI[2];
  if (local_10 == (Edge *)0x0) {
    local_18 = (PoolArray<btConvexHullInternal::Edge> *)in_RDI[1];
    if (local_18 == (PoolArray<btConvexHullInternal::Edge> *)0x0) {
      local_18 = (PoolArray<btConvexHullInternal::Edge> *)
                 btAlignedAllocInternal((size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
      ;
      in_RSI = (EVP_PKEY_CTX *)(ulong)*(uint *)(in_RDI + 3);
      PoolArray<btConvexHullInternal::Edge>::PoolArray
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      local_18->next = (PoolArray<btConvexHullInternal::Edge> *)*in_RDI;
      *in_RDI = local_18;
    }
    else {
      in_RDI[1] = local_18->next;
    }
    iVar1 = PoolArray<btConvexHullInternal::Edge>::init(local_18,in_RSI);
    local_10 = (Edge *)CONCAT44(extraout_var,iVar1);
  }
  in_RDI[2] = local_10->next;
  memset(local_10,0,0x30);
  return local_10;
}

Assistant:

T* newObject()
				{
					T* o = freeObjects;
					if (!o)
					{
						PoolArray<T>* p = nextArray;
						if (p)
						{
							nextArray = p->next;
						}
						else
						{
							p = new(btAlignedAlloc(sizeof(PoolArray<T>), 16)) PoolArray<T>(arraySize);
							p->next = arrays;
							arrays = p;
						}
						o = p->init();
					}
					freeObjects = o->next;
					return new(o) T();
				}